

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_encoder.c
# Opt level: O3

uint64_t lzma_mt_block_size(lzma_filter *filters)

{
  lzma_filter_encoder *plVar1;
  lzma_vli lVar2;
  uint64_t uVar3;
  lzma_filter_encoder *plVar4;
  lzma_filter_encoder *plVar5;
  long lVar6;
  ulong uVar7;
  
  lVar2 = filters->id;
  if (lVar2 == 0xffffffffffffffff) {
LAB_004194ab:
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    lVar6 = 0;
    do {
      plVar4 = encoders;
      if (lVar2 != 0x4000000000000001) {
        plVar5 = encoders;
        do {
          plVar4 = plVar5 + 1;
          plVar1 = plVar5 + 1;
          plVar5 = plVar4;
        } while (plVar1->id != lVar2);
      }
      if (plVar4->block_size != (_func_uint64_t_void_ptr *)0x0) {
        uVar3 = (*plVar4->block_size)(filters[lVar6].options);
        if (uVar7 < uVar3) {
          uVar7 = uVar3;
        }
        if (uVar3 == 0) goto LAB_004194ab;
      }
      lVar6 = lVar6 + 1;
      lVar2 = filters[lVar6].id;
    } while (lVar2 != 0xffffffffffffffff);
  }
  return uVar7;
}

Assistant:

extern uint64_t
lzma_mt_block_size(const lzma_filter *filters)
{
	uint64_t max = 0;

	for (size_t i = 0; filters[i].id != LZMA_VLI_UNKNOWN; ++i) {
		const lzma_filter_encoder *const fe
				= encoder_find(filters[i].id);
		if (fe->block_size != NULL) {
			const uint64_t size
					= fe->block_size(filters[i].options);
			if (size == 0)
				return 0;

			if (size > max)
				max = size;
		}
	}

	return max;
}